

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coded_stream.h
# Opt level: O2

void __thiscall
google::protobuf::io::CodedInputStream::BackUpInputToCurrentPosition(CodedInputStream *this)

{
  if (0 < this->overflow_bytes_ + this->buffer_size_after_limit_ +
          (*(int *)&this->buffer_end_ - *(int *)&this->buffer_)) {
    (*this->input_->_vptr_ZeroCopyInputStream[3])();
    this->total_bytes_read_ =
         (this->total_bytes_read_ - this->buffer_size_after_limit_) +
         ((int)this->buffer_ - *(int *)&this->buffer_end_);
    this->buffer_end_ = this->buffer_;
    this->buffer_size_after_limit_ = 0;
    this->overflow_bytes_ = 0;
  }
  return;
}

Assistant:

inline int CodedInputStream::BufferSize() const {
  return static_cast<int>(buffer_end_ - buffer_);
}